

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O0

int sqlite3Init(sqlite3 *db,char **pzErrMsg)

{
  uint uVar1;
  uint uVar2;
  sqlite3 *in_RDI;
  int commit_internal;
  int rc;
  int i;
  char **in_stack_00000088;
  int in_stack_00000094;
  sqlite3 *in_stack_00000098;
  int in_stack_ffffffffffffffdc;
  uint in_stack_ffffffffffffffe0;
  int local_18;
  int local_14;
  
  uVar2 = (uint)(((in_RDI->flags & 2U) != 0 ^ 0xffU) & 1);
  local_18 = 0;
  (in_RDI->init).busy = '\x01';
  in_RDI->enc = in_RDI->aDb->pSchema->enc;
  local_14 = 0;
  while( true ) {
    uVar1 = in_stack_ffffffffffffffe0 & 0xffffff;
    if (local_18 == 0) {
      uVar1 = CONCAT13(local_14 < in_RDI->nDb,(int3)in_stack_ffffffffffffffe0);
    }
    in_stack_ffffffffffffffe0 = uVar1;
    if ((char)(in_stack_ffffffffffffffe0 >> 0x18) == '\0') break;
    if (((((in_RDI->aDb[local_14].pSchema)->schemaFlags & 1) != 1) && (local_14 != 1)) &&
       (local_18 = sqlite3InitOne(in_stack_00000098,in_stack_00000094,in_stack_00000088),
       local_18 != 0)) {
      sqlite3ResetOneSchema
                ((sqlite3 *)CONCAT44(uVar2,in_stack_ffffffffffffffe0),in_stack_ffffffffffffffdc);
    }
    local_14 = local_14 + 1;
  }
  if (((local_18 == 0) && (((in_RDI->aDb[1].pSchema)->schemaFlags & 1) != 1)) &&
     (local_18 = sqlite3InitOne(in_stack_00000098,in_stack_00000094,in_stack_00000088),
     local_18 != 0)) {
    sqlite3ResetOneSchema
              ((sqlite3 *)CONCAT44(uVar2,in_stack_ffffffffffffffe0),in_stack_ffffffffffffffdc);
  }
  (in_RDI->init).busy = '\0';
  if ((local_18 == 0) && (uVar2 != 0)) {
    sqlite3CommitInternalChanges(in_RDI);
  }
  return local_18;
}

Assistant:

SQLITE_PRIVATE int sqlite3Init(sqlite3 *db, char **pzErrMsg){
  int i, rc;
  int commit_internal = !(db->flags&SQLITE_InternChanges);
  
  assert( sqlite3_mutex_held(db->mutex) );
  assert( sqlite3BtreeHoldsMutex(db->aDb[0].pBt) );
  assert( db->init.busy==0 );
  rc = SQLITE_OK;
  db->init.busy = 1;
  ENC(db) = SCHEMA_ENC(db);
  for(i=0; rc==SQLITE_OK && i<db->nDb; i++){
    if( DbHasProperty(db, i, DB_SchemaLoaded) || i==1 ) continue;
    rc = sqlite3InitOne(db, i, pzErrMsg);
    if( rc ){
      sqlite3ResetOneSchema(db, i);
    }
  }

  /* Once all the other databases have been initialized, load the schema
  ** for the TEMP database. This is loaded last, as the TEMP database
  ** schema may contain references to objects in other databases.
  */
#ifndef SQLITE_OMIT_TEMPDB
  assert( db->nDb>1 );
  if( rc==SQLITE_OK && !DbHasProperty(db, 1, DB_SchemaLoaded) ){
    rc = sqlite3InitOne(db, 1, pzErrMsg);
    if( rc ){
      sqlite3ResetOneSchema(db, 1);
    }
  }
#endif

  db->init.busy = 0;
  if( rc==SQLITE_OK && commit_internal ){
    sqlite3CommitInternalChanges(db);
  }

  return rc; 
}